

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

void duckdb_zstd::HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  bool bVar6;
  uint uVar7;
  BYTE *pBVar8;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  BYTE *pBVar16;
  ulong uVar17;
  U64 UVar18;
  U64 UVar19;
  U64 UVar20;
  ulong uVar21;
  U64 UVar22;
  ulong *local_58 [5];
  BYTE *ip [4];
  
  pvVar3 = args->dt;
  pBVar4 = args->oend;
  pBVar5 = args->ilowest;
  UVar20 = args->bits[0];
  UVar22 = args->bits[1];
  UVar18 = args->bits[2];
  UVar19 = args->bits[3];
  local_58[2] = (ulong *)args->ip[2];
  local_58[3] = (ulong *)args->ip[3];
  local_58[0] = (ulong *)args->ip[0];
  local_58[1] = (ulong *)args->ip[1];
  pBVar12 = args->op[0];
  pBVar10 = args->op[1];
  pBVar11 = args->op[2];
  pBVar8 = args->op[3];
  do {
    uVar14 = (ulong)((long)pBVar4 - (long)pBVar8) / 5;
    uVar9 = (ulong)((long)local_58[0] - (long)pBVar5) / 7;
    if (uVar14 < uVar9) {
      uVar9 = uVar14;
    }
    if (uVar9 == 0) {
      iVar13 = 2;
      bVar6 = false;
    }
    else {
      lVar15 = 1;
      do {
        bVar6 = local_58[lVar15] >= local_58[lVar15 + -1];
        if (local_58[lVar15] < local_58[lVar15 + -1]) {
          iVar13 = 7;
          goto LAB_003b8fbb;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      iVar13 = 0;
    }
LAB_003b8fbb:
    if (bVar6) {
      pBVar16 = pBVar8 + uVar9 * 5;
      do {
        uVar1 = *(ushort *)((long)pvVar3 + (UVar20 >> 0x35) * 2);
        uVar9 = UVar20 << ((ulong)uVar1 & 0x3f);
        *pBVar12 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (UVar22 >> 0x35) * 2);
        uVar14 = UVar22 << ((ulong)uVar1 & 0x3f);
        *pBVar10 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (UVar18 >> 0x35) * 2);
        uVar21 = UVar18 << ((ulong)uVar1 & 0x3f);
        *pBVar11 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (UVar19 >> 0x35) * 2);
        uVar17 = UVar19 << ((ulong)uVar1 & 0x3f);
        *pBVar8 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
        uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
        pBVar12[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar14 >> 0x35) * 2);
        uVar14 = uVar14 << ((ulong)uVar1 & 0x3f);
        pBVar10[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar21 >> 0x35) * 2);
        uVar21 = uVar21 << ((ulong)uVar1 & 0x3f);
        pBVar11[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar17 >> 0x35) * 2);
        uVar17 = uVar17 << ((ulong)uVar1 & 0x3f);
        pBVar8[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
        uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
        pBVar12[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar14 >> 0x35) * 2);
        uVar14 = uVar14 << ((ulong)uVar1 & 0x3f);
        pBVar10[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar21 >> 0x35) * 2);
        uVar21 = uVar21 << ((ulong)uVar1 & 0x3f);
        pBVar11[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar17 >> 0x35) * 2);
        uVar17 = uVar17 << ((ulong)uVar1 & 0x3f);
        pBVar8[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
        uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
        pBVar12[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar14 >> 0x35) * 2);
        uVar14 = uVar14 << ((ulong)uVar1 & 0x3f);
        pBVar10[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar21 >> 0x35) * 2);
        uVar21 = uVar21 << ((ulong)uVar1 & 0x3f);
        pBVar11[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar17 >> 0x35) * 2);
        uVar17 = uVar17 << ((ulong)uVar1 & 0x3f);
        pBVar8[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
        pBVar12[4] = (BYTE)(uVar1 >> 8);
        uVar2 = *(ushort *)((long)pvVar3 + (uVar14 >> 0x35) * 2);
        uVar14 = uVar14 << ((ulong)uVar2 & 0x3f);
        pBVar10[4] = (BYTE)(uVar2 >> 8);
        uVar2 = *(ushort *)((long)pvVar3 + (uVar21 >> 0x35) * 2);
        uVar21 = uVar21 << ((ulong)uVar2 & 0x3f);
        pBVar11[4] = (BYTE)(uVar2 >> 8);
        uVar2 = *(ushort *)((long)pvVar3 + (uVar17 >> 0x35) * 2);
        uVar17 = uVar17 << ((ulong)uVar2 & 0x3f);
        pBVar8[4] = (BYTE)(uVar2 >> 8);
        uVar7 = 0;
        for (uVar9 = uVar9 << ((ulong)uVar1 & 0x3f); (uVar9 & 1) == 0;
            uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        pBVar12 = pBVar12 + 5;
        local_58[0] = (ulong *)((long)local_58[0] - (ulong)(uVar7 >> 3));
        UVar20 = (*local_58[0] | 1) << ((byte)uVar7 & 7);
        uVar7 = 0;
        for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        local_58[1] = (ulong *)((long)local_58[1] - (ulong)(uVar7 >> 3));
        pBVar10 = pBVar10 + 5;
        UVar22 = (*local_58[1] | 1) << ((byte)uVar7 & 7);
        uVar7 = 0;
        for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        pBVar11 = pBVar11 + 5;
        local_58[2] = (ulong *)((long)local_58[2] - (ulong)(uVar7 >> 3));
        UVar18 = (*local_58[2] | 1) << ((byte)uVar7 & 7);
        uVar7 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        pBVar8 = pBVar8 + 5;
        local_58[3] = (ulong *)((long)local_58[3] - (ulong)(uVar7 >> 3));
        UVar19 = (*local_58[3] | 1) << ((byte)uVar7 & 7);
      } while (pBVar8 < pBVar16);
      iVar13 = 0;
    }
    if (iVar13 != 0) {
      args->bits[0] = UVar20;
      args->bits[1] = UVar22;
      args->bits[2] = UVar18;
      args->bits[3] = UVar19;
      args->ip[0] = (BYTE *)local_58[0];
      args->ip[1] = (BYTE *)local_58[1];
      args->ip[2] = (BYTE *)local_58[2];
      args->ip[3] = (BYTE *)local_58[3];
      args->op[0] = pBVar12;
      args->op[1] = pBVar10;
      args->op[2] = pBVar11;
      args->op[3] = pBVar8;
      return;
    }
  } while( true );
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilowest) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X1_DECODE_SYMBOL(_stream, _symbol)                 \
    do {                                                        \
        int const index = (int)(bits[(_stream)] >> 53);         \
        int const entry = (int)dtable[index];                   \
        bits[(_stream)] <<= (entry & 0x3F);                     \
        op[(_stream)][(_symbol)] = (BYTE)((entry >> 8) & 0xFF); \
    } while (0)

#define HUF_4X1_RELOAD_STREAM(_stream)                              \
    do {                                                            \
        int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
        int const nbBits = ctz & 7;                                 \
        int const nbBytes = ctz >> 3;                               \
        op[(_stream)] += 5;                                         \
        ip[(_stream)] -= nbBytes;                                   \
        bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
        bits[(_stream)] <<= nbBits;                                 \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols in each of the 4 streams */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 1);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 2);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 3);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 4);

            /* Reload each of the 4 the bitstreams */
            HUF_4X_FOR_EACH_STREAM(HUF_4X1_RELOAD_STREAM);
        } while (op[3] < olimit);

#undef HUF_4X1_DECODE_SYMBOL
#undef HUF_4X1_RELOAD_STREAM
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}